

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

int Compute_file_md5(char *file_path,char *md5_str)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  uchar md5_value [16];
  fstream file;
  uchar data [1024];
  byte local_6a8 [16];
  MD5_CTX local_698;
  long local_638;
  uint local_630;
  byte abStack_618 [496];
  uchar local_428 [1032];
  
  std::fstream::fstream(&local_638,file_path,_S_in);
  lVar2 = *(long *)(local_638 + -0x18);
  if ((abStack_618[lVar2] & 5) == 0) {
    local_698.count[0] = 0;
    local_698.count[1] = 0;
    local_698.state[0] = 0x67452301;
    local_698.state[1] = 0xefcdab89;
    local_698.state[2] = 0x98badcfe;
    local_698.state[3] = 0x10325476;
    while( true ) {
      std::ios::widen((char)local_6a8 + (char)lVar2 + 'p');
      plVar1 = (long *)std::istream::get((char *)&local_638,(long)local_428,'\0');
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      MD5Update(&local_698,local_428,local_630);
      lVar2 = *(long *)(local_638 + -0x18);
    }
    std::fstream::close();
    MD5Final(&local_698,local_6a8);
    iVar3 = 0;
    lVar2 = 0;
    do {
      snprintf(md5_str,3,"%02x",(ulong)local_6a8[lVar2]);
      lVar2 = lVar2 + 1;
      md5_str = md5_str + 2;
    } while (lVar2 != 0x10);
  }
  else {
    perror("open");
    iVar3 = -1;
  }
  std::fstream::~fstream(&local_638);
  return iVar3;
}

Assistant:

int Compute_file_md5(const char *file_path, char *md5_str)
{
    int i;
    unsigned char data[READ_DATA_SIZE];
    unsigned char md5_value[MD5_SIZE];
    MD5_CTX md5;

    std::fstream file(file_path, std::ios::in);
    if (!file)
    {
        perror("open");
        return -1;
    }

    // init md5
    MD5Init(&md5);

    while (file.get((char*)data, READ_DATA_SIZE)) {
        MD5Update(&md5, data, (unsigned int)file.gcount());
    }

    file.close();

    MD5Final(&md5, md5_value);

    // convert md5 value to md5 string
    for(i = 0; i < MD5_SIZE; i++) {
        snprintf(md5_str + i*2, 2+1, "%02x", md5_value[i]);
    }

    return 0;
}